

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::EnergyScan
          (Error *__return_storage_ptr__,CommissionerApp *this,uint32_t aChannelMask,uint8_t aCount,
          uint16_t aPeriod,uint16_t aScanDuration,string *aDstAddr)

{
  uint16_t aScanDuration_local;
  uint16_t aPeriod_local;
  uint8_t aCount_local;
  uint32_t aChannelMask_local;
  CommissionerApp *this_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::EnergyScan(uint32_t           aChannelMask,
                                  uint8_t            aCount,
                                  uint16_t           aPeriod,
                                  uint16_t           aScanDuration,
                                  const std::string &aDstAddr)
{
    UNUSED(aChannelMask);
    UNUSED(aCount);
    UNUSED(aPeriod);
    UNUSED(aScanDuration);
    UNUSED(aDstAddr);
    return Error{};
}